

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O2

void qsound_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(int *)((long)param + 0x250) != 0) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      if ((*(char *)((long)param + lVar3 * 0x24 + 0x1a) != '\0') &&
         (puVar4 = (uint *)((long)param + lVar3 * 0x24 + 8), (char)puVar4[8] == '\0')) {
        for (uVar5 = 0; samples != uVar5; uVar5 = uVar5 + 1) {
          uVar6 = (puVar4[7] >> 0xc) + puVar4[1];
          puVar4[1] = uVar6;
          uVar8 = (puVar4[7] & 0xfff) + puVar4[3];
          puVar4[7] = uVar8;
          uVar1 = *(ushort *)((long)puVar4 + 10);
          if (uVar1 <= uVar6) {
            uVar2 = (ushort)puVar4[2];
            if (uVar2 == 0) {
              puVar4[1] = uVar6 - 1;
              puVar4[7] = uVar8 + 0x1000;
              break;
            }
            uVar7 = uVar1 - uVar2;
            if (uVar6 - uVar2 < (uint)uVar1) {
              uVar7 = (ushort)(uVar6 - uVar2);
            }
            uVar6 = (uint)uVar7;
            puVar4[1] = uVar6;
          }
          iVar9 = (uint)(ushort)puVar4[4] *
                  (int)*(char *)(*(long *)((long)param + 0x248) +
                                (ulong)((uVar6 | *puVar4) & *(uint *)((long)param + 0x254)));
          (*outputs)[uVar5] = (*outputs)[uVar5] + ((int)(puVar4[5] * iVar9) >> 0xe);
          outputs[1][uVar5] = outputs[1][uVar5] + ((int)(iVar9 * puVar4[6]) >> 0xe);
        }
      }
    }
  }
  return;
}

Assistant:

static void qsound_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	qsound_state *chip = (qsound_state *)param;
	UINT32 i,j;
	UINT32 offset;
	INT8 sample;
	qsound_channel *pC;

	// Clear the buffers
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	if (! chip->sample_rom_length)
		return;

	for (j = 0; j < QSOUND_CHANNELS; j++)
	{
		pC=&chip->channel[j];
		if (pC->enabled && ! pC->Muted)
		{
			// Go through the buffer and add voice contributions
			for (i = 0; i < samples; i++)
			{
				pC->address += (pC->step_ptr >> 12);
				pC->step_ptr &= 0xfff;
				pC->step_ptr += pC->freq;

				if (pC->address >= pC->end)
				{
					if (pC->loop)
					{
						// Reached the end, restart the loop
						pC->address -= pC->loop;

						// Make sure we don't overflow (what does the real chip do in this case?)
						if (pC->address >= pC->end)
							pC->address = pC->end - pC->loop;

						pC->address &= 0xffff;
					}
					else
					{
						// Reached the end of a non-looped sample
						//pC->enabled = 0;
						pC->address --;	// ensure that old ripped VGMs still work
						pC->step_ptr += 0x1000;
						break;
					}
				}
				
				offset = pC->bank | pC->address;
				sample = chip->sample_rom[offset & chip->sample_rom_mask];
				outputs[0][i] += ((sample * pC->lvol * pC->vol) >> 14);
				outputs[1][i] += ((sample * pC->rvol * pC->vol) >> 14);
			}
		}
	}
}